

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

void __thiscall Translator::printFragmentList(Translator *this)

{
  bool bVar1;
  int iVar2;
  PrintICT *this_00;
  Canonicalizer *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fragment *pFVar3;
  
  if (this->fragmentList != (Fragment *)0x0) {
    this_00 = (PrintICT *)operator_new(0x10);
    PrintICT::PrintICT(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n------------------------------",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---- INTERMEDIATE CODE TREE ----",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"------------------------------\n",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    (*this->fragmentList->_vptr_Fragment[2])(this->fragmentList,this_00);
    this_01 = (Canonicalizer *)operator_new(0x10);
    Canonicalizer::Canonicalizer(this_01);
    iVar2 = (*(this_01->super_VisitorCICT)._vptr_VisitorCICT[2])(this_01,this->fragmentList);
    pFVar3 = (Fragment *)CONCAT44(extraout_var,iVar2);
    while( true ) {
      this->fragmentList = pFVar3;
      bVar1 = Canonicalizer::isChanged(this_01);
      if (!bVar1) break;
      this_01->changed = false;
      iVar2 = (*this->fragmentList->_vptr_Fragment[3])(this->fragmentList,this_01);
      pFVar3 = (Fragment *)CONCAT44(extraout_var_00,iVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n------------------------------",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---- CANONICAL INTERMEDIATE CODE TREE ----",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"------------------------------\n",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    (*this->fragmentList->_vptr_Fragment[2])(this->fragmentList,this_00);
    return;
  }
  return;
}

Assistant:

void Translator::printFragmentList() {
    if(fragmentList)
    {
        PrintICT *visitorICT = new PrintICT();
        std::cout << "\n------------------------------" << std::endl;
        std::cout << "---- INTERMEDIATE CODE TREE ----" << std::endl;
        std::cout << "------------------------------\n" << std::endl;
        fragmentList->accept(visitorICT);
        Canonicalizer *canonicalizer = new Canonicalizer();

        fragmentList = canonicalizer->visit(fragmentList);
        while (canonicalizer->isChanged()) {
//        std::cout << "x" << std::endl;
//        fragmentList->accept(visitorICT);
            canonicalizer->change();
            fragmentList = fragmentList->accept(canonicalizer);

        }
        std::cout << "\n------------------------------" << std::endl;
        std::cout << "---- CANONICAL INTERMEDIATE CODE TREE ----" << std::endl;
        std::cout << "------------------------------\n" << std::endl;

        fragmentList->accept(visitorICT);
    }
}